

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

QDirPrivate * __thiscall QDir::d_func(QDir *this)

{
  QDirPrivate *pQVar1;
  
  pQVar1 = (this->d_ptr).d.ptr;
  if (pQVar1 != (QDirPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type_conflict *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
      pQVar1 = (this->d_ptr).d.ptr;
    }
    return pQVar1;
  }
  return (QDirPrivate *)0x0;
}

Assistant:

constexpr P get() const noexcept { return ptr; }